

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

Expression * __thiscall rsg::AssignOp::createNextChild(AssignOp *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess valueRange_00;
  Expression *pEVar1;
  ValueRangeAccess local_80;
  VariableType *local_68;
  Scalar *local_60;
  Scalar *local_58;
  ValueRangeAccess local_50;
  VariableType *local_38;
  Scalar *local_30;
  Scalar *local_28;
  GeneratorState *local_20;
  GeneratorState *state_local;
  AssignOp *this_local;
  
  local_20 = state;
  state_local = (GeneratorState *)this;
  if (this->m_lvalueExpr == (Expression *)0x0) {
    ValueRange::asAccess(&local_50,&this->m_valueRange);
    local_38 = local_50.super_ConstValueRangeAccess.m_type;
    local_30 = local_50.super_ConstValueRangeAccess.m_min;
    local_28 = local_50.super_ConstValueRangeAccess.m_max;
    valueRange.m_min = local_50.super_ConstValueRangeAccess.m_min;
    valueRange.m_type = local_50.super_ConstValueRangeAccess.m_type;
    valueRange.m_max = local_50.super_ConstValueRangeAccess.m_max;
    pEVar1 = Expression::createRandomLValue(state,valueRange);
    this->m_lvalueExpr = pEVar1;
    this_local = (AssignOp *)this->m_lvalueExpr;
  }
  else if (this->m_rvalueExpr == (Expression *)0x0) {
    ValueRange::asAccess(&local_80,&this->m_valueRange);
    local_68 = local_80.super_ConstValueRangeAccess.m_type;
    local_60 = local_80.super_ConstValueRangeAccess.m_min;
    local_58 = local_80.super_ConstValueRangeAccess.m_max;
    valueRange_00.m_min = local_80.super_ConstValueRangeAccess.m_min;
    valueRange_00.m_type = local_80.super_ConstValueRangeAccess.m_type;
    valueRange_00.m_max = local_80.super_ConstValueRangeAccess.m_max;
    pEVar1 = Expression::createRandom(state,valueRange_00);
    this->m_rvalueExpr = pEVar1;
    this_local = (AssignOp *)this->m_rvalueExpr;
  }
  else {
    this_local = (AssignOp *)0x0;
  }
  return &this_local->super_Expression;
}

Assistant:

Expression* AssignOp::createNextChild (GeneratorState& state)
{
	if (m_lvalueExpr == DE_NULL)
	{
		// Construct lvalue
		// \todo [2011-03-14 pyry] Proper l-value generation:
		//  - pure L-value part is generated first
		//  - variable valuerange is made unbound
		//  - R-value is generated
		//  - R-values in L-value are generated
		m_lvalueExpr = Expression::createRandomLValue(state, m_valueRange.asAccess());
		return m_lvalueExpr;
	}
	else if (m_rvalueExpr == DE_NULL)
	{
		// Construct value expr
		m_rvalueExpr = Expression::createRandom(state, m_valueRange.asAccess());
		return m_rvalueExpr;
	}
	else
		return DE_NULL;
}